

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this)

{
  UnknownFieldSet *this_00;
  
  this_00 = mutable_unknown_fields<google::protobuf::UnknownFieldSet>(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DoClear() {
    mutable_unknown_fields<T>()->Clear();
  }